

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

uint32_t syncsearch(uint32_t *have,uint8_t *buf,uint32_t len)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t uVar4;
  uint uVar5;
  
  uVar2 = *have;
  uVar1 = 0;
  if (uVar2 < 4 && len != 0) {
    uVar1 = 0;
    do {
      uVar4 = 0xff;
      if (uVar2 < 2) {
        uVar4 = '\0';
      }
      uVar5 = 4 - uVar2;
      uVar3 = uVar2 + 1;
      if (buf[uVar1] != '\0') {
        uVar5 = 0;
      }
      uVar2 = uVar5;
      if (uVar4 == buf[uVar1]) {
        uVar2 = uVar3;
      }
      uVar1 = uVar1 + 1;
    } while ((uVar1 < len) && (uVar2 < 4));
  }
  *have = uVar2;
  return (uint32_t)uVar1;
}

Assistant:

static uint32_t syncsearch(uint32_t *have, const uint8_t *buf, uint32_t len) {
    uint32_t got, next;

    got = *have;
    next = 0;
    while (next < len && got < 4) {
        if ((int)(buf[next]) == (got < 2 ? 0 : 0xff))
            got++;
        else if (buf[next])
            got = 0;
        else
            got = 4 - got;
        next++;
    }
    *have = got;
    return next;
}